

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O1

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/string_object.cpp:297:69)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_string_object_cpp:297:69)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  gc_heap *h;
  uint *puVar1;
  ulong uVar2;
  ulong uVar3;
  pointer pvVar4;
  undefined8 extraout_XMM0_Qb;
  double dVar5;
  double dVar6;
  string str;
  gc_heap_ptr_untyped local_68;
  double local_58;
  gc_heap_ptr_untyped local_48;
  double local_38;
  undefined8 uStack_30;
  wstring_view local_28;
  
  h = (this->f).global.super_gc_heap_ptr_untyped.heap_;
  to_string((mjs *)&local_48,h,this_);
  pvVar4 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
      super__Vector_impl_data._M_finish == pvVar4) {
    pvVar4 = (pointer)&value::undefined;
  }
  local_38 = to_integer(pvVar4);
  pvVar4 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_58 = INFINITY;
  uStack_30 = extraout_XMM0_Qb;
  if ((1 < (ulong)(((long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pvVar4 >> 3) *
                  -0x3333333333333333)) && (pvVar4[1].type_ != undefined)) {
    local_58 = to_integer(pvVar4 + 1);
  }
  puVar1 = (uint *)gc_heap_ptr_untyped::get(&local_48);
  if (local_38 < 0.0) {
    dVar5 = local_38 + (double)*puVar1;
    local_38 = 0.0;
    if (0.0 <= dVar5) {
      local_38 = dVar5;
    }
    uStack_30 = 0;
  }
  dVar6 = (double)*puVar1 - local_38;
  dVar5 = 0.0;
  if (0.0 <= local_58) {
    dVar5 = local_58;
  }
  local_58 = dVar6;
  if (dVar5 <= dVar6) {
    local_58 = dVar5;
  }
  if (local_58 <= 0.0) {
    local_28._M_len = 0;
    local_28._M_str = L"";
    string::string((string *)&local_68,h,(string_view *)&local_28);
    __return_storage_ptr__->type_ = string;
    (__return_storage_ptr__->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped
    .heap_ = local_68.heap_;
    *(uint32_t *)((long)&__return_storage_ptr__->field_1 + 8) = local_68.pos_;
    if (local_68.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_68.heap_,(gc_heap_ptr_untyped *)&(__return_storage_ptr__->field_1).s_);
    }
  }
  else {
    puVar1 = (uint *)gc_heap_ptr_untyped::get(&local_48);
    uVar2 = (long)(local_38 - 9.223372036854776e+18) & (long)local_38 >> 0x3f | (long)local_38;
    uVar3 = *puVar1 - uVar2;
    if (*puVar1 < uVar2) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr");
    }
    local_28._M_len =
         (long)(local_58 - 9.223372036854776e+18) & (long)local_58 >> 0x3f | (long)local_58;
    if (uVar3 < local_28._M_len) {
      local_28._M_len = uVar3;
    }
    local_28._M_str = (wchar_t *)(puVar1 + uVar2 + 1);
    string::string((string *)&local_68,h,&local_28);
    __return_storage_ptr__->type_ = string;
    (__return_storage_ptr__->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped
    .heap_ = local_68.heap_;
    *(uint32_t *)((long)&__return_storage_ptr__->field_1 + 8) = local_68.pos_;
    if (local_68.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_68.heap_,(gc_heap_ptr_untyped *)&(__return_storage_ptr__->field_1).s_);
    }
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_68);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_48);
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }